

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  string *psVar1;
  ostream *poVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string filename;
  cmGeneratedFileStream fout;
  string local_2c0;
  undefined8 local_2a0;
  undefined1 *local_298;
  undefined1 local_290 [32];
  undefined1 local_270 [16];
  undefined8 local_260;
  undefined1 *local_258;
  size_type local_250;
  pointer local_248;
  undefined8 local_240;
  char *local_238;
  
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  local_270._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_270._0_8_ = psVar1->_M_string_length;
  local_298 = local_290;
  local_2a0 = 1;
  local_290[0] = 0x2f;
  local_260 = 1;
  local_248 = (this->ProjectName)._M_dataplus._M_p;
  local_250 = (this->ProjectName)._M_string_length;
  local_240 = 0xc;
  local_238 = ".kateproject";
  views._M_len = 4;
  views._M_array = (iterator)local_270;
  local_258 = local_298;
  cmCatViews_abi_cxx11_(&local_2c0,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_270,&local_2c0,false,None);
  if ((*(byte *)((long)&local_250 + (long)*(_func_int **)(local_270._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"#Generated by ",0xe);
    psVar1 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_270,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", do not edit.\n",0xf);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::CreateDummyKateProjectFile(
  const cmLocalGenerator& lg) const
{
  std::string filename =
    cmStrCat(lg.GetBinaryDirectory(), '/', this->ProjectName, ".kateproject");
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}